

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

void __thiscall cs_impl::any::swap(any *this,any *obj,bool raw)

{
  proxy *ppVar1;
  proxy *ppVar2;
  baseHolder *pbVar3;
  error *this_00;
  string local_38;
  
  ppVar1 = this->mDat;
  ppVar2 = obj->mDat;
  if ((ppVar2 == (proxy *)0x0 || !raw) || ppVar1 == (proxy *)0x0) {
    this->mDat = ppVar2;
    obj->mDat = ppVar1;
  }
  else {
    if (((ppVar1->is_rvalue != false) || (0 < ppVar1->protect_level)) || (0 < ppVar2->protect_level)
       ) {
      this_00 = (error *)__cxa_allocate_exception(0x28);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"E000J","");
      cov::error::error(this_00,&local_38);
      __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
    }
    pbVar3 = ppVar1->data;
    ppVar1->data = ppVar2->data;
    ppVar2->data = pbVar3;
  }
  return;
}

Assistant:

void swap(any &&obj, bool raw = false)
		{
			if (this->mDat != nullptr && obj.mDat != nullptr && raw) {
				if (mDat->is_rvalue || this->mDat->protect_level > 0 || obj.mDat->protect_level > 0)
					throw cov::error("E000J");
				std::swap(this->mDat->data, obj.mDat->data);
			}
			else
				std::swap(this->mDat, obj.mDat);
		}